

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O2

void __thiscall
IntrusiveListIteratorTest_cbegin_cend_backward_Test::
~IntrusiveListIteratorTest_cbegin_cend_backward_Test
          (IntrusiveListIteratorTest_cbegin_cend_backward_Test *this)

{
  anon_unknown.dwarf_6462d::IntrusiveListIteratorTest::~IntrusiveListIteratorTest
            (&this->super_IntrusiveListIteratorTest);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(IntrusiveListIteratorTest, cbegin_cend_backward) {
  TestBackward(list_.cbegin(), list_.cend(), {3, 2, 1});
  TestBackward(clist_.cbegin(), clist_.cend(), {3, 2, 1});
}